

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O1

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::update_insert
          (DynamicPartialIndex *this,vertex_t v,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *in,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  
  uVar5 = (ulong)v;
  puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  uVar7 = uVar5;
  if (uVar5 < uVar6) {
    bVar1 = puVar3[uVar5];
    puVar4 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar8 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1) {
      uVar7 = (ulong)*puVar8;
      puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
      if (uVar6 <= uVar7) goto LAB_0010cf21;
      bVar2 = puVar3[uVar7];
      if (bVar2 < this->k_) {
        uVar7 = uVar5;
        if (uVar6 <= uVar5) goto LAB_0010cf21;
        if (bVar2 + 1 < (uint)puVar3[uVar5]) {
          puVar3[uVar5] = bVar2 + 1;
        }
      }
    }
    puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3;
    uVar7 = uVar5;
    if (uVar5 < uVar6) {
      bVar2 = puVar3[uVar5];
      if (bVar2 < this->k_) {
        if (bVar2 < bVar1) {
          resume_bfs(this,v,graph,dist);
          return;
        }
        puVar4 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar8 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                      .super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1) {
          puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar6 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
          uVar7 = uVar5;
          if ((uVar6 <= uVar5) || (uVar7 = (ulong)*puVar8, uVar6 <= uVar7)) goto LAB_0010cf21;
          if (puVar3[uVar5] + 1 < (uint)puVar3[uVar7]) {
            puVar3[uVar7] = puVar3[uVar5] + 1;
            resume_bfs(this,*puVar8,graph,dist);
          }
        }
      }
      return;
    }
  }
LAB_0010cf21:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,uVar6
            );
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::update_insert(vertex_t v, const std::vector<vertex_t> &out,
                                                               const std::vector<vertex_t> &in,
                                                               const std::vector<std::vector<vertex_t>> &graph,
                                                               std::vector<distance_t> &dist) {
    auto d = dist.at(v);
    for (const auto &s : in){
        if (dist.at(s) < k_ && dist.at(s) + 1 < dist.at(v)){
            dist.at(v) = dist.at(s) + 1;
        }
    }

    if (dist.at(v) >= k_){
        return;
    }

    if (dist.at(v) < d){
        resume_bfs(v, graph, dist);
    }
    else {
        for (const auto &t : out) {
            if (dist.at(v) + 1 < dist.at(t)){
                dist.at(t) = dist.at(v) + 1;
                resume_bfs(t, graph, dist);
            }
        }
    }
}